

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespace.cpp
# Opt level: O3

void __thiscall
Js::ModuleNamespace::AddUnambiguousNonLocalExport
          (ModuleNamespace *this,PropertyId propertyId,ModuleNameRecord *nonLocalExportNameRecord)

{
  Recycler *this_00;
  Recycler *alloc;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  undefined1 local_60 [8];
  TrackAllocData data;
  PropertyId propertyId_local;
  
  pBVar1 = (this->unambiguousNonLocalExports).ptr;
  data._36_4_ = propertyId;
  if (pBVar1 == (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)0x0) {
    this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->recycler;
    local_60 = (undefined1  [8])
               &JsUtil::
                BaseDictionary<int,Js::ModuleNameRecord,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4fc0cd0;
    data.filename._0_4_ = 0x92;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_60);
    pBVar1 = (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)new<Memory::Recycler>(0x38,alloc,0x387914);
    (pBVar1->buckets).ptr = (int *)0x0;
    (pBVar1->entries).ptr = (SimpleDictionaryEntry<int,_Js::ModuleNameRecord> *)0x0;
    pBVar1->alloc = this_00;
    pBVar1->size = 0;
    pBVar1->bucketCount = 0;
    pBVar1->count = 0;
    pBVar1->freeCount = 0;
    pBVar1->modFunctionIndex = 0x4b;
    pBVar1->stats = (Type)0x0;
    JsUtil::
    BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize(pBVar1,4);
    Memory::Recycler::WBSetBit((char *)&this->unambiguousNonLocalExports);
    (this->unambiguousNonLocalExports).ptr = pBVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->unambiguousNonLocalExports);
    pBVar1 = (this->unambiguousNonLocalExports).ptr;
  }
  JsUtil::
  BaseDictionary<int,Js::ModuleNameRecord,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<int,Js::ModuleNameRecord,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
            ((BaseDictionary<int,Js::ModuleNameRecord,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)pBVar1,(int *)&data.field_0x24,nonLocalExportNameRecord);
  return;
}

Assistant:

void ModuleNamespace::AddUnambiguousNonLocalExport(PropertyId propertyId, ModuleNameRecord* nonLocalExportNameRecord)
    {
        Recycler* recycler = GetScriptContext()->GetRecycler();
        if (unambiguousNonLocalExports == nullptr)
        {
            unambiguousNonLocalExports = RecyclerNew(recycler, UnambiguousExportMap, recycler, 4);
        }
        // keep a local copy of the module/
        unambiguousNonLocalExports->AddNew(propertyId, *nonLocalExportNameRecord);
    }